

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O0

axbStatus_t axbVecAXPY(axbVec_s *y,axbScalar_s *alpha,axbVec_s *x)

{
  _func_axbStatus_t_axbVec_s_ptr_axbScalar_s_ptr_axbVec_s_ptr_void_ptr *op;
  axbOpDescriptor_t op_desc;
  axbVec_s *x_local;
  axbScalar_s *alpha_local;
  axbVec_s *y_local;
  
  op_desc._48_8_ = x;
  if (x->init == 0x1d232) {
    if (y->init == 0x1d232) {
      memcpy(&op,y->opBackend->op_table + 0x10,0x38);
      (*op)(y,alpha,(axbVec_s *)op_desc._48_8_,op_desc.func);
      y_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Vector not fully initialized!\n");
      y_local._4_4_ = 0x1d232;
    }
  }
  else {
    fprintf(_stderr,"Vector not fully initialized!\n");
    y_local._4_4_ = 0x1d232;
  }
  return y_local._4_4_;
}

Assistant:

axbStatus_t axbVecAXPY(struct axbVec_s *y, const struct axbScalar_s *alpha, const struct axbVec_s *x)
{
  AXB_VECTOR_INIT_CHECK(x);
  AXB_VECTOR_INIT_CHECK(y);

  axbOpDescriptor_t op_desc = y->opBackend->op_table[AXB_OP_VEC_AXPY];
  axbStatus_t (*op)(struct axbVec_s *, const struct axbScalar_s *, const struct axbVec_s *, void*) = (axbStatus_t (*)(struct axbVec_s *, const struct axbScalar_s *, const struct axbVec_s *, void*)) op_desc.func;
  op(y, alpha, x, op_desc.func_data);
  return 0;
}